

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzverysparsematrix.cpp
# Opt level: O2

void __thiscall
TPZVerySparseMatrix<std::complex<double>_>::TPZVerySparseMatrix
          (TPZVerySparseMatrix<std::complex<double>_> *this,void **vtt,
          TPZFMatrix<std::complex<double>_> *cp)

{
  _Rb_tree_header *p_Var1;
  int64_t iVar2;
  char cVar3;
  bool bVar4;
  long lVar5;
  TPZFMatrix<std::complex<double>_> *pTVar6;
  int64_t j;
  long lVar7;
  int64_t i;
  long lVar8;
  complex<double> a_00;
  complex<double> a;
  undefined1 local_40 [16];
  
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[3];
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[2];
  iVar2 = (cp->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow =
       (cp->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol = iVar2;
  cVar3 = (cp->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDefPositive;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed =
       (cp->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDefPositive = cVar3;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)*vtt;
  p_Var1 = &(this->fExtraSparseData)._M_t._M_impl.super__Rb_tree_header;
  (this->fExtraSparseData)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fExtraSparseData)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fExtraSparseData)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->fExtraSparseData)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->fExtraSparseData)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (lVar8 = 0; lVar8 < (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
      lVar8 = lVar8 + 1) {
    for (lVar7 = 0; lVar7 < (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
        lVar7 = lVar7 + 1) {
      lVar5 = lVar8;
      pTVar6 = cp;
      (*(cp->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x24])(cp,lVar8,lVar7);
      a_00._M_value._8_8_ = lVar5;
      a_00._M_value._0_8_ = pTVar6;
      bVar4 = IsZero(a_00);
      if (!bVar4) {
        (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x23])(this,lVar8,lVar7,local_40);
      }
    }
  }
  return;
}

Assistant:

TPZVerySparseMatrix<TVar>::TPZVerySparseMatrix(const TPZFMatrix<TVar> &cp) : TPZRegisterClassId(&TPZVerySparseMatrix::ClassId),TPZMatrix<TVar>(cp)
{
	for(int64_t i=0; i<this->fRow; i++)
	{
		for(int64_t j=0; j<this->fCol; j++)
		{
			TVar a = cp.GetVal(i,j);
			if(!IsZero(a)) PutVal(i,j,a);
		}
	}
}